

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mvcUtils.c
# Opt level: O0

void Mvc_CoverSupportAnd(Mvc_Cover_t *pCover,Mvc_Cube_t *pSupp)

{
  uint local_28;
  uint local_24;
  int _i__1;
  int _i_;
  Mvc_Cube_t *pCube;
  Mvc_Cube_t *pSupp_local;
  Mvc_Cover_t *pCover_local;
  
  if ((*(uint *)&pSupp->field_0x8 & 0xffffff) == 0) {
    pSupp->pData[0] = 0xffffffff >> ((byte)((uint)*(undefined4 *)&pSupp->field_0x8 >> 0x18) & 0x1f);
  }
  else if ((*(uint *)&pSupp->field_0x8 & 0xffffff) == 1) {
    pSupp->pData[0] = 0xffffffff;
    *(uint *)&pSupp->field_0x14 =
         0xffffffff >> ((byte)((uint)*(undefined4 *)&pSupp->field_0x8 >> 0x18) & 0x1f);
  }
  else {
    pSupp->pData[*(uint *)&pSupp->field_0x8 & 0xffffff] =
         0xffffffff >> ((byte)((uint)*(undefined4 *)&pSupp->field_0x8 >> 0x18) & 0x1f);
    local_24 = *(uint *)&pSupp->field_0x8 & 0xffffff;
    while (local_24 = local_24 - 1, -1 < (int)local_24) {
      pSupp->pData[(int)local_24] = 0xffffffff;
    }
  }
  for (__i__1 = (pCover->lCubes).pHead; __i__1 != (Mvc_Cube_t *)0x0; __i__1 = __i__1->pNext) {
    if ((*(uint *)&pSupp->field_0x8 & 0xffffff) == 0) {
      pSupp->pData[0] = pSupp->pData[0] & __i__1->pData[0];
    }
    else if ((*(uint *)&pSupp->field_0x8 & 0xffffff) == 1) {
      pSupp->pData[0] = pSupp->pData[0] & __i__1->pData[0];
      *(uint *)&pSupp->field_0x14 = *(uint *)&pSupp->field_0x14 & *(uint *)&__i__1->field_0x14;
    }
    else {
      for (local_28 = *(uint *)&pSupp->field_0x8 & 0xffffff; -1 < (int)local_28;
          local_28 = local_28 - 1) {
        pSupp->pData[(int)local_28] = pSupp->pData[(int)local_28] & __i__1->pData[(int)local_28];
      }
    }
  }
  return;
}

Assistant:

void Mvc_CoverSupportAnd( Mvc_Cover_t * pCover, Mvc_Cube_t * pSupp )
{
    Mvc_Cube_t * pCube;
    // clean the support
    Mvc_CubeBitFill( pSupp );
    // collect the support
    Mvc_CoverForEachCube( pCover, pCube )
        Mvc_CubeBitAnd( pSupp, pSupp, pCube );
}